

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void make_constructors(GlobalVars *gv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  node *secname;
  uint8_t *d;
  ObjectUnit *ou;
  long lVar5;
  ulong uVar6;
  node *pnVar7;
  ulong uVar8;
  size_t size;
  int cnt;
  node *pnVar9;
  node *local_48;
  
  if (gv->dest_object != 0) {
    return;
  }
  if (gv->ctor_symbol == (Symbol *)0x0) {
    if (gv->dtor_symbol == (Symbol *)0x0) {
      return;
    }
  }
  else if ((gv->ctor_symbol->flags & 2) != 0) {
    pnVar9 = (node *)&gv->pripointers;
    pnVar7 = (node *)0x0;
    while (secname = pnVar7, pnVar9 = pnVar9->next, pnVar9->next != (node *)0x0) {
      iVar3 = strcmp((char *)pnVar9[1].pred,gv->ctor_symbol->name);
      pnVar7 = secname;
      if (((iVar3 == 0) && (pnVar7 = pnVar9[1].next, secname != (node *)0x0)) &&
         (iVar3 = strcmp((char *)secname,(char *)pnVar9[1].next), pnVar7 = secname, iVar3 != 0)) {
        error(0x7d);
      }
    }
    bVar1 = true;
    if (secname == (node *)0x0) {
      secname = (node *)xtors_secname(gv,".ctors");
    }
    goto LAB_001104df;
  }
  secname = (node *)0x0;
  bVar1 = false;
LAB_001104df:
  if ((gv->dtor_symbol == (Symbol *)0x0) || ((gv->dtor_symbol->flags & 2) == 0)) {
    if (!bVar1) {
      return;
    }
    bVar2 = false;
    local_48 = (node *)0x0;
  }
  else {
    pnVar9 = (node *)&gv->pripointers;
    pnVar7 = (node *)0x0;
    while (local_48 = pnVar7, pnVar9 = pnVar9->next, pnVar9->next != (node *)0x0) {
      iVar3 = strcmp((char *)pnVar9[1].pred,gv->dtor_symbol->name);
      pnVar7 = local_48;
      if (((iVar3 == 0) && (pnVar7 = pnVar9[1].next, local_48 != (node *)0x0)) &&
         (iVar3 = strcmp((char *)local_48,(char *)pnVar9[1].next), pnVar7 = local_48, iVar3 != 0)) {
        error(0x7d);
      }
    }
    bVar2 = true;
    if (local_48 == (node *)0x0) {
      local_48 = (node *)xtors_secname(gv,".dtors");
    }
  }
  iVar3 = 0;
  cnt = 0;
  pnVar9 = (gv->pripointers).first;
  while (pnVar7 = pnVar9, pnVar9 = pnVar7->next, pnVar9 != (node *)0x0) {
    if (bVar1) {
      iVar4 = strcmp((char *)pnVar7[1].pred,gv->ctor_symbol->name);
      cnt = cnt + (uint)(iVar4 == 0);
    }
    if (bVar2) {
      iVar4 = strcmp((char *)pnVar7[1].pred,gv->dtor_symbol->name);
      iVar3 = iVar3 + (uint)(iVar4 == 0);
    }
  }
  lVar5 = (long)(fff[gv->dest_format]->addr_bits / '\b');
  uVar6 = (long)(cnt + 2);
  if (!bVar1) {
    uVar6 = 0;
  }
  uVar8 = (ulong)(iVar3 + 2);
  if (!bVar2) {
    uVar8 = 0;
  }
  size = (uVar8 + uVar6) * lVar5;
  d = (uint8_t *)alloczero(size);
  ou = art_objunit(gv,"INITEXIT",d,size);
  if (bVar1) {
    write_constructors(gv,ou,gv->ctor_symbol,cnt,0,(char *)secname);
  }
  if (bVar2) {
    write_constructors(gv,ou,gv->dtor_symbol,iVar3,uVar6 * lVar5,(char *)local_48);
  }
  ou->lnkfile->type = '\x01';
  add_objunit(gv,ou,0);
  return;
}

Assistant:

void make_constructors(struct GlobalVars *gv)
/* Create an artificial object for constructor/destructor lists
   and fill them will entries from the PriPointer list. */
{
  if (!gv->dest_object && (gv->ctor_symbol || gv->dtor_symbol)) {
    int nctors=0,ndtors=0;
    bool ctors=FALSE,dtors=FALSE;
    const char *csecname=NULL,*dsecname=NULL;
    unsigned long clen,dlen;
    struct PriPointer *pp;
    uint8_t *data;
    struct ObjectUnit *ou;

    /* check if constructors or destructors are needed (referenced) */
    if (gv->ctor_symbol) {
      if (gv->ctor_symbol->flags & SYMF_REFERENCED) {
        ctors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->ctor_symbol->name)) {
            if (csecname) {
              if (strcmp(csecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              csecname = pp->secname;
          }
        }
        if (!csecname)
          csecname = xtors_secname(gv,ctors_name);
      }
    }
    if (gv->dtor_symbol) {
      if (gv->dtor_symbol->flags & SYMF_REFERENCED) {
        dtors = TRUE;
        for (pp=(struct PriPointer *)gv->pripointers.first;
             pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
          if (!strcmp(pp->listname,gv->dtor_symbol->name)) {
            if (dsecname) {
              if (strcmp(dsecname,pp->secname))
                error(125);  /* CTORS/DTORS spread over multiple sections */
            }
            else
              dsecname = pp->secname;
          }
        }
        if (!dsecname)
          dsecname = xtors_secname(gv,dtors_name);
      }
    }
    if (!ctors && !dtors)
      return;

    /* count number of constructor and destructor pointers */
    for (pp=(struct PriPointer *)gv->pripointers.first;
         pp->n.next!=NULL; pp=(struct PriPointer *)pp->n.next) {
      if (ctors) {
        if (!strcmp(pp->listname,gv->ctor_symbol->name))
          nctors++;
      }
      if (dtors) {
        if (!strcmp(pp->listname,gv->dtor_symbol->name))
          ndtors++;
      }
    }

    /* create artificial object */
    clen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (ctors ? nctors+2 : 0);
    dlen = (unsigned long)(fff[gv->dest_format]->addr_bits / 8) *
            (dtors ? ndtors+2 : 0);
    data = alloczero(clen + dlen);
    ou = art_objunit(gv,"INITEXIT",data,clen+dlen);

    /* write constructors/destructors */
    if (ctors)
      write_constructors(gv,ou,gv->ctor_symbol,nctors,0,csecname);
    if (dtors)
      write_constructors(gv,ou,gv->dtor_symbol,ndtors,clen,dsecname);

    /* enqueue artificial object unit into linking process */
    ou->lnkfile->type = ID_OBJECT;
    add_objunit(gv,ou,FALSE);
  }
}